

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O1

int __thiscall t_markdown_generator::print_type(t_markdown_generator *this,t_type *ttype)

{
  ofstream_with_content_based_conditional_update *poVar1;
  t_markdown_generator *ptVar2;
  _func_int **pp_Var3;
  pointer pcVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar9;
  undefined4 extraout_var_01;
  t_markdown_generator *this_00;
  ulong uVar10;
  string prog_name;
  string type_name;
  char local_d1;
  string local_d0;
  undefined1 local_b0 [32];
  string local_90;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  char local_40 [16];
  
  iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
  pp_Var3 = (ttype->super_t_doc)._vptr_t_doc;
  if ((char)iVar7 != '\0') {
    iVar7 = (*pp_Var3[0xe])();
    if ((char)iVar7 == '\0') {
      iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
      if ((char)iVar7 == '\0') {
        iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
        if ((char)iVar7 == '\0') {
          return 0;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->f_out_,"map&lt;",7);
        iVar8 = print_type(this,*(t_type **)&ttype[1].super_t_doc.has_doc_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->f_out_,", ",2);
        iVar7 = print_type(this,*(t_type **)&ttype[1].annotations_._M_t._M_impl);
        iVar7 = iVar7 + iVar8 + 5;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->f_out_,"set&lt;",7);
        iVar7 = print_type(this,*(t_type **)&ttype[1].super_t_doc.has_doc_);
        iVar7 = iVar7 + 5;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->f_out_,"list&lt;",8);
      iVar7 = print_type(this,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      iVar7 = iVar7 + 6;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->f_out_,"&gt;",4);
    return iVar7;
  }
  iVar7 = (*pp_Var3[5])(ttype);
  if ((char)iVar7 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->f_out_,"```",3);
    iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
    if ((char)iVar7 == '\0') {
      iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      lVar5 = *(long *)CONCAT44(extraout_var_00,iVar7);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,lVar5,((long *)CONCAT44(extraout_var_00,iVar7))[1] + lVar5);
    }
    else {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"binary","");
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&this->f_out_,local_d0._M_dataplus._M_p,local_d0._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"```",3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    return (int)*(undefined8 *)(CONCAT44(extraout_var_01,iVar7) + 8);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar4 = (ttype->program_->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar4,pcVar4 + (ttype->program_->name_)._M_string_length);
  iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  lVar5 = *(long *)CONCAT44(extraout_var,iVar7);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,lVar5,((long *)CONCAT44(extraout_var,iVar7))[1] + lVar5);
  poVar1 = &this->f_out_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[```",4);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"```](",5);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_d0._M_dataplus._M_p,
             local_d0._M_dataplus._M_p + local_d0._M_string_length);
  make_file_name((string *)&local_50,this,&local_70);
  make_file_link((string *)local_b0,this,(string *)&local_50);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(char *)local_b0._0_8_,local_b0._8_8_);
  this_00 = (t_markdown_generator *)0x3881e5;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"#",1);
  ptVar2 = (t_markdown_generator *)(local_b0 + 0x10);
  if ((t_markdown_generator *)local_b0._0_8_ != ptVar2) {
    operator_delete((void *)local_b0._0_8_);
  }
  if ((char *)local_50._M_allocated_capacity != local_40) {
    operator_delete((void *)local_50._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[9])(ttype);
  uVar10 = 8;
  if ((char)iVar7 == '\0') {
    iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype);
    if ((char)iVar7 == '\0') {
      iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
      if ((char)iVar7 == '\0') {
        iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
        if ((char)iVar7 == '\0') {
          iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0x11])(ttype);
          if ((char)iVar7 == '\0') goto LAB_00241660;
          this_00 = (t_markdown_generator *)0x3919dc;
        }
        else {
          uVar10 = 0xc;
          this_00 = (t_markdown_generator *)0x3919fc;
        }
      }
      else {
        uVar10 = (ulong)(byte)ttype[1].annotations_._M_t._M_impl.field_0x1;
        pcVar6 = "#struct-";
        if (uVar10 != 0) {
          pcVar6 = "#union-";
        }
        this_00 = (t_markdown_generator *)(pcVar6 + 1);
        uVar10 = uVar10 ^ 7;
      }
    }
    else {
      uVar10 = 10;
      this_00 = (t_markdown_generator *)0x391a14;
    }
  }
  else {
    this_00 = (t_markdown_generator *)0x391a0a;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)this_00,uVar10);
LAB_00241660:
  iVar7 = (int)local_90._M_string_length;
  if (ttype->program_ != (this->super_t_generator).program_) {
    str_to_id((string *)local_b0,this_00,&local_d0);
    this_00 = (t_markdown_generator *)local_b0._0_8_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(char *)local_b0._0_8_,local_b0._8_8_);
    if ((t_markdown_generator *)local_b0._0_8_ != ptVar2) {
      operator_delete((void *)local_b0._0_8_);
    }
    iVar7 = (int)local_90._M_string_length + (int)local_d0._M_string_length + 1;
  }
  str_to_id((string *)local_b0,this_00,&local_90);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,(char *)local_b0._0_8_,local_b0._8_8_);
  local_d1 = ')';
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_d1,1);
  if ((t_markdown_generator *)local_b0._0_8_ != ptVar2) {
    operator_delete((void *)local_b0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return iVar7;
}

Assistant:

int t_markdown_generator::print_type(t_type* ttype) {
  std::string::size_type len = 0;
  if (ttype->is_container()) {
    if (ttype->is_list()) {
      f_out_ << "list&lt;";
      len = 6 + print_type(((t_list*)ttype)->get_elem_type());
      f_out_ << "&gt;";
    } else if (ttype->is_set()) {
      f_out_ << "set&lt;";
      len = 5 + print_type(((t_set*)ttype)->get_elem_type());
      f_out_ << "&gt;";
    } else if (ttype->is_map()) {
      f_out_ << "map&lt;";
      len = 5 + print_type(((t_map*)ttype)->get_key_type());
      f_out_ << ", ";
      len += print_type(((t_map*)ttype)->get_val_type());
      f_out_ << "&gt;";
    }
  } else if (ttype->is_base_type()) {
    f_out_ << "```" << (ttype->is_binary() ? "binary" : ttype->get_name()) 
           << "```";
    len = ttype->get_name().size();
  } else {
    string prog_name = ttype->get_program()->get_name();
    string type_name = ttype->get_name();
    f_out_ << "[```" << type_name << "```](" 
           << make_file_link(make_file_name(prog_name)) << "#";
    if (ttype->is_typedef()) {
      f_out_ << "typedef-";
    } else if (ttype->is_xception()) {
      f_out_ << "exception-";
    } else if (ttype->is_struct()) {
      if(((t_struct*)ttype)->is_union())
        f_out_ << "union-";
      else
        f_out_ << "struct-";
    } else if (ttype->is_enum()) {
      f_out_ << "enumeration-";
    } else if (ttype->is_service()) {
      f_out_ << "service-";
    }
    len = type_name.size();
    if (ttype->get_program() != program_) {
      f_out_ << str_to_id(prog_name); 
      len += prog_name.size() + 1;
    }
    f_out_ <<  str_to_id(type_name) << ')';
  }
  return (int)len;
}